

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalDefinition.cpp
# Opt level: O2

void __thiscall license::locate::ExternalDefinition::~ExternalDefinition(ExternalDefinition *this)

{
  LocatorStrategy::~LocatorStrategy(&this->super_LocatorStrategy);
  operator_delete(this);
  return;
}

Assistant:

ExternalDefinition::~ExternalDefinition() {}